

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneralMatrixMatrix.h
# Opt level: O0

void Eigen::internal::general_matrix_matrix_product<long,_double,_0,_false,_double,_1,_false,_0>::
     run(long rows,long cols,long depth,double *_lhs,long lhsStride,double *_rhs,long rhsStride,
        ResScalar *res,long resStride,ResScalar alpha,level3_blocking<double,_double> *blocking,
        GemmParallelInfo<long> *info)

{
  ResScalar *res_00;
  long lVar1;
  double *pdVar2;
  long lVar3;
  long lVar4;
  undefined8 blockB_00;
  undefined8 blockA_00;
  long lVar5;
  DenseIndex DVar6;
  long *plVar7;
  ulong size;
  ulong size_00;
  ulong size_01;
  LhsScalar *pLVar8;
  RhsScalar *pRVar9;
  LhsScalar *pLVar10;
  double *pdVar11;
  LhsScalar LStack_1c8;
  double *local_1c0;
  double *local_1b8;
  double *local_1b0;
  double *local_1a8;
  RhsScalar *local_1a0;
  RhsScalar *local_198;
  RhsScalar *local_190;
  double *local_188;
  RhsScalar *local_180;
  RhsScalar *local_178;
  RhsScalar *local_170;
  double *local_168;
  LhsScalar *local_160;
  LhsScalar *local_158;
  long local_150;
  long local_148;
  long actual_mc;
  long i2;
  long local_130;
  long actual_kc;
  long k2;
  aligned_stack_memory_handler<double> blockW_stack_memory_destructor;
  double *blockW;
  aligned_stack_memory_handler<double> blockB_stack_memory_destructor;
  double *blockB;
  undefined1 local_d0 [8];
  aligned_stack_memory_handler<double> blockA_stack_memory_destructor;
  double *blockA;
  size_t sizeW;
  size_t sizeB;
  size_t sizeA;
  gebp_kernel<double,_double,_long,_4,_4,_false,_false> gebp;
  gemm_pack_rhs<double,_long,_4,_1,_false,_false> pack_rhs;
  DenseIndex DStack_90;
  gemm_pack_lhs<double,_long,_4,_2,_0,_false,_false> pack_lhs;
  long mc;
  long kc;
  const_blas_data_mapper<double,_long,_1> rhs;
  const_blas_data_mapper<double,_long,_0> lhs;
  ResScalar alpha_local;
  double *_rhs_local;
  long lhsStride_local;
  double *_lhs_local;
  long depth_local;
  long cols_local;
  long rows_local;
  ulong local_18;
  ulong local_10;
  
  pLVar10 = &LStack_1c8;
  _lhs_local = (double *)depth;
  depth_local = cols;
  cols_local = rows;
  const_blas_data_mapper<double,_long,_0>::const_blas_data_mapper
            ((const_blas_data_mapper<double,_long,_0> *)&rhs.m_stride,_lhs,lhsStride);
  const_blas_data_mapper<double,_long,_1>::const_blas_data_mapper
            ((const_blas_data_mapper<double,_long,_1> *)&kc,_rhs,rhsStride);
  DVar6 = level3_blocking<double,_double>::kc(blocking);
  DStack_90 = level3_blocking<double,_double>::mc(blocking);
  plVar7 = std::min<long>(&cols_local,&stack0xffffffffffffff70);
  lVar1 = *plVar7;
  ignore_unused_variable<Eigen::internal::GemmParallelInfo<long>*>(&info);
  size = DVar6 * lVar1;
  size_00 = DVar6 * depth_local;
  size_01 = DVar6 * 8;
  local_10 = size;
  if (0x1fffffffffffffff < size) {
    throw_std_bad_alloc();
  }
  pLVar8 = level3_blocking<double,_double>::blockA(blocking);
  if (pLVar8 == (LhsScalar *)0x0) {
    if (size * 8 < 0x20001) {
      pLVar10 = (LhsScalar *)((long)&LStack_1c8 - (size * 8 + 0xf & 0xfffffffffffffff0));
      local_160 = pLVar10;
    }
    else {
      local_160 = (LhsScalar *)aligned_malloc(size * 8);
    }
    local_158 = local_160;
  }
  else {
    local_158 = level3_blocking<double,_double>::blockA(blocking);
    pLVar10 = &LStack_1c8;
  }
  blockA_stack_memory_destructor._16_8_ = local_158;
  *(undefined8 *)((long)pLVar10 + -8) = 0x11581f;
  pLVar8 = level3_blocking<double,_double>::blockA(blocking);
  if (pLVar8 == (LhsScalar *)0x0) {
    local_168 = (double *)blockA_stack_memory_destructor._16_8_;
  }
  else {
    local_168 = (double *)0x0;
  }
  pdVar2 = local_168;
  *(undefined8 *)((long)pLVar10 + -8) = 0x115874;
  aligned_stack_memory_handler<double>::aligned_stack_memory_handler
            ((aligned_stack_memory_handler<double> *)local_d0,pdVar2,size,0x20000 < size * 8);
  local_18 = size_00;
  if (0x1fffffffffffffff < size_00) {
    *(undefined8 *)((long)pLVar10 + -8) = 0x115894;
    throw_std_bad_alloc();
  }
  *(undefined8 *)((long)pLVar10 + -8) = 0x1158a3;
  pRVar9 = level3_blocking<double,_double>::blockB(blocking);
  if (pRVar9 == (RhsScalar *)0x0) {
    if (size_00 * 8 < 0x20001) {
      pLVar10 = (LhsScalar *)((long)pLVar10 + -(size_00 * 8 + 0xf & 0xfffffffffffffff0));
      local_178 = pLVar10;
    }
    else {
      *(undefined8 *)((long)pLVar10 + -8) = 0x115903;
      local_180 = (RhsScalar *)aligned_malloc(size_00 * 8);
      local_178 = local_180;
    }
    local_170 = local_178;
  }
  else {
    *(undefined8 *)((long)pLVar10 + -8) = 0x1158b2;
    local_170 = level3_blocking<double,_double>::blockB(blocking);
  }
  blockB_stack_memory_destructor._16_8_ = local_170;
  *(undefined8 *)((long)pLVar10 + -8) = 0x115941;
  pRVar9 = level3_blocking<double,_double>::blockB(blocking);
  if (pRVar9 == (RhsScalar *)0x0) {
    local_188 = (double *)blockB_stack_memory_destructor._16_8_;
  }
  else {
    local_188 = (double *)0x0;
  }
  pdVar2 = local_188;
  *(undefined8 *)((long)pLVar10 + -8) = 0x11598f;
  aligned_stack_memory_handler<double>::aligned_stack_memory_handler
            ((aligned_stack_memory_handler<double> *)&blockW,pdVar2,size_00,0x20000 < size_00 * 8);
  rows_local = size_01;
  if (0x1fffffffffffffff < size_01) {
    *(undefined8 *)((long)pLVar10 + -8) = 0x1159b1;
    throw_std_bad_alloc();
  }
  *(undefined8 *)((long)pLVar10 + -8) = 0x1159c0;
  pRVar9 = level3_blocking<double,_double>::blockW(blocking);
  if (pRVar9 == (RhsScalar *)0x0) {
    if ((ulong)(DVar6 << 6) < 0x20001) {
      pLVar10 = (LhsScalar *)((long)pLVar10 + DVar6 * -0x40);
      local_198 = pLVar10;
    }
    else {
      *(undefined8 *)((long)pLVar10 + -8) = 0x115a20;
      local_1a0 = (RhsScalar *)aligned_malloc(DVar6 << 6);
      local_198 = local_1a0;
    }
    local_190 = local_198;
  }
  else {
    *(undefined8 *)((long)pLVar10 + -8) = 0x1159cf;
    local_190 = level3_blocking<double,_double>::blockW(blocking);
  }
  blockW_stack_memory_destructor._16_8_ = local_190;
  *(undefined8 *)((long)pLVar10 + -8) = 0x115a5e;
  pRVar9 = level3_blocking<double,_double>::blockW(blocking);
  if (pRVar9 == (RhsScalar *)0x0) {
    local_1a8 = (double *)blockW_stack_memory_destructor._16_8_;
  }
  else {
    local_1a8 = (double *)0x0;
  }
  pdVar2 = local_1a8;
  *(undefined8 *)((long)pLVar10 + -8) = 0x115aac;
  aligned_stack_memory_handler<double>::aligned_stack_memory_handler
            ((aligned_stack_memory_handler<double> *)&k2,pdVar2,size_01,
             0x20000 < (ulong)(DVar6 << 6));
  for (actual_kc = 0; actual_kc < (long)_lhs_local; actual_kc = DVar6 + actual_kc) {
    i2 = actual_kc + DVar6;
    *(undefined8 *)((long)pLVar10 + -8) = 0x115aef;
    plVar7 = std::min<long>(&i2,(long *)&_lhs_local);
    lVar3 = actual_kc;
    local_130 = *plVar7 - actual_kc;
    local_1b8 = (double *)blockB_stack_memory_destructor._16_8_;
    *(undefined8 *)((long)pLVar10 + -8) = 0x115b25;
    pdVar11 = const_blas_data_mapper<double,_long,_1>::operator()
                        ((const_blas_data_mapper<double,_long,_1> *)&kc,lVar3,0);
    lVar4 = depth_local;
    lVar3 = local_130;
    pdVar2 = local_1b8;
    local_1b0 = pdVar11;
    *(undefined8 *)((long)pLVar10 + -8) = 0;
    *(undefined8 *)((long)pLVar10 + -0x10) = 0;
    *(undefined8 *)((long)pLVar10 + -0x18) = 0x115b6d;
    gemm_pack_rhs<double,_long,_4,_1,_false,_false>::operator()
              ((gemm_pack_rhs<double,_long,_4,_1,_false,_false> *)((long)&sizeA + 6),pdVar2,pdVar11,
               rhsStride,lVar3,lVar4,*(long *)((long)pLVar10 + -0x10),*(long *)((long)pLVar10 + -8))
    ;
    for (actual_mc = 0; actual_mc < cols_local; actual_mc = lVar1 + actual_mc) {
      local_150 = actual_mc + lVar1;
      *(undefined8 *)((long)pLVar10 + -8) = 0x115bb4;
      plVar7 = std::min<long>(&local_150,&cols_local);
      lVar4 = actual_kc;
      lVar3 = actual_mc;
      local_148 = *plVar7 - actual_mc;
      local_1c0 = (double *)blockA_stack_memory_destructor._16_8_;
      *(undefined8 *)((long)pLVar10 + -8) = 0x115bed;
      pdVar11 = const_blas_data_mapper<double,_long,_0>::operator()
                          ((const_blas_data_mapper<double,_long,_0> *)&rhs.m_stride,lVar3,lVar4);
      lVar4 = local_130;
      lVar3 = local_148;
      pdVar2 = local_1c0;
      *(undefined8 *)((long)pLVar10 + -8) = 0;
      *(undefined8 *)((long)pLVar10 + -0x10) = 0;
      *(undefined8 *)((long)pLVar10 + -0x18) = 0x115c2b;
      gemm_pack_lhs<double,_long,_4,_2,_0,_false,_false>::operator()
                ((gemm_pack_lhs<double,_long,_4,_2,_0,_false,_false> *)((long)&sizeA + 7),pdVar2,
                 pdVar11,lhsStride,lVar4,lVar3,*(long *)((long)pLVar10 + -0x10),
                 *(long *)((long)pLVar10 + -8));
      lVar5 = depth_local;
      blockA_00 = blockA_stack_memory_destructor._16_8_;
      blockB_00 = blockB_stack_memory_destructor._16_8_;
      lVar4 = local_130;
      lVar3 = local_148;
      res_00 = res + actual_mc;
      *(undefined8 *)((long)pLVar10 + -0x10) = blockW_stack_memory_destructor._16_8_;
      *(long *)((long)pLVar10 + -0x38) = lVar5;
      *(long *)((long)pLVar10 + -0x40) = lVar4;
      *(undefined8 *)((long)pLVar10 + -0x18) = 0;
      *(undefined8 *)((long)pLVar10 + -0x20) = 0;
      *(undefined8 *)((long)pLVar10 + -0x28) = 0xffffffffffffffff;
      *(undefined8 *)((long)pLVar10 + -0x30) = 0xffffffffffffffff;
      *(undefined8 *)((long)pLVar10 + -0x48) = 0x115cae;
      gebp_kernel<double,_double,_long,_4,_4,_false,_false>::operator()
                ((gebp_kernel<double,_double,_long,_4,_4,_false,_false> *)((long)&sizeA + 5),res_00,
                 resStride,(double *)blockA_00,(double *)blockB_00,lVar3,
                 *(long *)((long)pLVar10 + -0x40),*(long *)((long)pLVar10 + -0x38),alpha,
                 *(long *)((long)pLVar10 + -0x30),*(long *)((long)pLVar10 + -0x28),
                 *(long *)((long)pLVar10 + -0x20),*(long *)((long)pLVar10 + -0x18),
                 *(double **)((long)pLVar10 + -0x10));
    }
  }
  *(undefined8 *)((long)pLVar10 + -8) = 0x115d3d;
  aligned_stack_memory_handler<double>::~aligned_stack_memory_handler
            ((aligned_stack_memory_handler<double> *)&k2);
  *(undefined8 *)((long)pLVar10 + -8) = 0x115d49;
  aligned_stack_memory_handler<double>::~aligned_stack_memory_handler
            ((aligned_stack_memory_handler<double> *)&blockW);
  *(undefined8 *)((long)pLVar10 + -8) = 0x115d55;
  aligned_stack_memory_handler<double>::~aligned_stack_memory_handler
            ((aligned_stack_memory_handler<double> *)local_d0);
  return;
}

Assistant:

static void run(Index rows, Index cols, Index depth,
  const LhsScalar* _lhs, Index lhsStride,
  const RhsScalar* _rhs, Index rhsStride,
  ResScalar* res, Index resStride,
  ResScalar alpha,
  level3_blocking<LhsScalar,RhsScalar>& blocking,
  GemmParallelInfo<Index>* info = 0)
{
  const_blas_data_mapper<LhsScalar, Index, LhsStorageOrder> lhs(_lhs,lhsStride);
  const_blas_data_mapper<RhsScalar, Index, RhsStorageOrder> rhs(_rhs,rhsStride);

  typedef gebp_traits<LhsScalar,RhsScalar> Traits;

  Index kc = blocking.kc();                   // cache block size along the K direction
  Index mc = (std::min)(rows,blocking.mc());  // cache block size along the M direction
  //Index nc = blocking.nc(); // cache block size along the N direction

  gemm_pack_lhs<LhsScalar, Index, Traits::mr, Traits::LhsProgress, LhsStorageOrder> pack_lhs;
  gemm_pack_rhs<RhsScalar, Index, Traits::nr, RhsStorageOrder> pack_rhs;
  gebp_kernel<LhsScalar, RhsScalar, Index, Traits::mr, Traits::nr, ConjugateLhs, ConjugateRhs> gebp;

#ifdef EIGEN_HAS_OPENMP
  if(info)
  {
    // this is the parallel version!
    Index tid = omp_get_thread_num();
    Index threads = omp_get_num_threads();
    
    std::size_t sizeA = kc*mc;
    std::size_t sizeW = kc*Traits::WorkSpaceFactor;
    ei_declare_aligned_stack_constructed_variable(LhsScalar, blockA, sizeA, 0);
    ei_declare_aligned_stack_constructed_variable(RhsScalar, w, sizeW, 0);
    
    RhsScalar* blockB = blocking.blockB();
    eigen_internal_assert(blockB!=0);

    // For each horizontal panel of the rhs, and corresponding vertical panel of the lhs...
    for(Index k=0; k<depth; k+=kc)
    {
      const Index actual_kc = (std::min)(k+kc,depth)-k; // => rows of B', and cols of the A'

      // In order to reduce the chance that a thread has to wait for the other,
      // let's start by packing A'.
      pack_lhs(blockA, &lhs(0,k), lhsStride, actual_kc, mc);

      // Pack B_k to B' in a parallel fashion:
      // each thread packs the sub block B_k,j to B'_j where j is the thread id.

      // However, before copying to B'_j, we have to make sure that no other thread is still using it,
      // i.e., we test that info[tid].users equals 0.
      // Then, we set info[tid].users to the number of threads to mark that all other threads are going to use it.
      while(info[tid].users!=0) {}
      info[tid].users += threads;

      pack_rhs(blockB+info[tid].rhs_start*actual_kc, &rhs(k,info[tid].rhs_start), rhsStride, actual_kc, info[tid].rhs_length);

      // Notify the other threads that the part B'_j is ready to go.
      info[tid].sync = k;

      // Computes C_i += A' * B' per B'_j
      for(Index shift=0; shift<threads; ++shift)
      {
        Index j = (tid+shift)%threads;

        // At this point we have to make sure that B'_j has been updated by the thread j,
        // we use testAndSetOrdered to mimic a volatile access.
        // However, no need to wait for the B' part which has been updated by the current thread!
        if(shift>0)
          while(info[j].sync!=k) {}

        gebp(res+info[j].rhs_start*resStride, resStride, blockA, blockB+info[j].rhs_start*actual_kc, mc, actual_kc, info[j].rhs_length, alpha, -1,-1,0,0, w);
      }

      // Then keep going as usual with the remaining A'
      for(Index i=mc; i<rows; i+=mc)
      {
        const Index actual_mc = (std::min)(i+mc,rows)-i;

        // pack A_i,k to A'
        pack_lhs(blockA, &lhs(i,k), lhsStride, actual_kc, actual_mc);

        // C_i += A' * B'
        gebp(res+i, resStride, blockA, blockB, actual_mc, actual_kc, cols, alpha, -1,-1,0,0, w);
      }

      // Release all the sub blocks B'_j of B' for the current thread,
      // i.e., we simply decrement the number of users by 1
      for(Index j=0; j<threads; ++j)
      {
        #pragma omp atomic
        info[j].users -= 1;
      }
    }
  }
  else
#endif // EIGEN_HAS_OPENMP
  {
    EIGEN_UNUSED_VARIABLE(info);

    // this is the sequential version!
    std::size_t sizeA = kc*mc;
    std::size_t sizeB = kc*cols;
    std::size_t sizeW = kc*Traits::WorkSpaceFactor;

    ei_declare_aligned_stack_constructed_variable(LhsScalar, blockA, sizeA, blocking.blockA());
    ei_declare_aligned_stack_constructed_variable(RhsScalar, blockB, sizeB, blocking.blockB());
    ei_declare_aligned_stack_constructed_variable(RhsScalar, blockW, sizeW, blocking.blockW());

    // For each horizontal panel of the rhs, and corresponding panel of the lhs...
    // (==GEMM_VAR1)
    for(Index k2=0; k2<depth; k2+=kc)
    {
      const Index actual_kc = (std::min)(k2+kc,depth)-k2;

      // OK, here we have selected one horizontal panel of rhs and one vertical panel of lhs.
      // => Pack rhs's panel into a sequential chunk of memory (L2 caching)
      // Note that this panel will be read as many times as the number of blocks in the lhs's
      // vertical panel which is, in practice, a very low number.
      pack_rhs(blockB, &rhs(k2,0), rhsStride, actual_kc, cols);

      // For each mc x kc block of the lhs's vertical panel...
      // (==GEPP_VAR1)
      for(Index i2=0; i2<rows; i2+=mc)
      {
        const Index actual_mc = (std::min)(i2+mc,rows)-i2;

        // We pack the lhs's block into a sequential chunk of memory (L1 caching)
        // Note that this block will be read a very high number of times, which is equal to the number of
        // micro vertical panel of the large rhs's panel (e.g., cols/4 times).
        pack_lhs(blockA, &lhs(i2,k2), lhsStride, actual_kc, actual_mc);

        // Everything is packed, we can now call the block * panel kernel:
        gebp(res+i2, resStride, blockA, blockB, actual_mc, actual_kc, cols, alpha, -1, -1, 0, 0, blockW);
      }
    }
  }
}